

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::key_question(Forth *this)

{
  long lVar1;
  uint x;
  
  requireDStackAvailable(this,1,"KEY?");
  if (this->readFromSource == FromStdCin) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x147440);
    std::istream::sync();
    std::ios_base::sync_with_stdio(true);
    (**(code **)(**(long **)(*(long *)(std::cin + -0x18) + 0x147528) + 0x30))();
  }
  else {
    x = 0;
    if (this->readFromSource != FromString) goto LAB_0010fe10;
    std::ios::clear((int)this + 800 + (int)*(undefined8 *)(*(long *)&this->std_cin + -0x18));
  }
  lVar1 = std::streambuf::in_avail();
  x = (&this->False)[0 < lVar1];
LAB_0010fe10:
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void key_question() {
			REQUIRE_DSTACK_AVAILABLE(1, "KEY?");
			Cell flag{} ;
			switch (readFromSource) {
				case FromString:
					std_cin.clear();
					flag = std_cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				case FromStdCin:
					std::cin.clear(); // clear previous error codes
					std::cin.sync();
					std::cin.sync_with_stdio(true);
					std::cin.rdbuf()->pubsync();
					flag = std::cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				default:
					break;
			}
			push(flag);
		}